

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestBackslash::ParserTestBackslash(ParserTestBackslash *this)

{
  ParserTestBackslash *this_local;
  
  ParserTest::ParserTest(&this->super_ParserTest);
  (this->super_ParserTest).super_Test._vptr_Test = (_func_int **)&PTR__ParserTestBackslash_00264418;
  return;
}

Assistant:

TEST_F(ParserTest, Backslash) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"foo = bar\\baz\n"
"foo2 = bar\\ baz\n"
));
  EXPECT_EQ("bar\\baz", state.bindings_.LookupVariable("foo"));
  EXPECT_EQ("bar\\ baz", state.bindings_.LookupVariable("foo2"));
}